

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O0

void InstructionSet::M68k::Primitive::add_sub<false,false,unsigned_char>
               (uchar source,uchar *destination,Status *status)

{
  byte value;
  byte bVar1;
  uchar result;
  Status *status_local;
  uchar *destination_local;
  uchar source_local;
  
  value = *destination - source;
  status->carry_flag = (ulong)(*destination < value);
  status->extend_flag = status->carry_flag;
  status->zero_result = (ulong)value;
  Status::set_negative<unsigned_char>(status,value);
  bVar1 = Numeric::overflow<false,unsigned_char>(*destination,source,value);
  status->overflow_flag = (ulong)bVar1;
  *destination = value;
  return;
}

Assistant:

static void add_sub(IntT source, IntT &destination, Status &status) {
	static_assert(!std::numeric_limits<IntT>::is_signed);

	IntT result = is_add ?
		destination + source :
		destination - source;
	status.carry_flag = is_add ? result < destination : result > destination;

	// If this is an extend operation, there's a second opportunity to create carry,
	// which requires a second test.
	if(is_extend && status.extend_flag) {
		if constexpr (is_add) {
			++result;
			status.carry_flag |= result == 0;
		} else {
			status.carry_flag |= result == 0;
			--result;
		}
	}
	status.extend_flag = status.carry_flag;

	// Extend operations can reset the zero flag only; non-extend operations
	// can either set it or reset it. Which in the reverse-logic world of
	// zero_result means ORing or storing.
	if constexpr (is_extend) {
		status.zero_result |= Status::FlagT(result);
	} else {
		status.zero_result = Status::FlagT(result);
	}
	status.set_negative(result);
	status.overflow_flag = Numeric::overflow<is_add>(destination, source, result);
	destination = result;
}